

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArduinoPressureSensor.cpp
# Opt level: O0

void * ArduinoPressureSensorThread(void *pParam)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  double dVar4;
  double local_8b0;
  interval local_8a8;
  double local_890;
  interval local_888;
  interval local_870;
  char local_858 [8];
  char szTemp [256];
  char szSaveFilePath [256];
  int local_650;
  int i;
  int errcount;
  int threadperiod;
  CHRONO chrono_period;
  undefined1 local_5f8 [4];
  BOOL bConnected;
  CHRONO chrono_filter;
  double filteredpressure;
  double pressure_prev;
  ARDUINOPRESSURESENSORDATA arduinopressuresensordata;
  ARDUINOPRESSURESENSOR arduinopressuresensor;
  void *pParam_local;
  
  filteredpressure = 0.0;
  chrono_filter.Suspended = 0;
  chrono_filter._68_4_ = 0;
  chrono_period._68_4_ = 0;
  i = 0x32;
  local_650 = 0;
  arduinopressuresensor.WaterDensity = (double)pParam;
  memset(&arduinopressuresensordata.Pressure,0,0x568);
  StartChrono((CHRONO *)local_5f8);
  StartChrono((CHRONO *)&errcount);
  do {
    while( true ) {
      StopChronoQuick((CHRONO *)&errcount);
      StartChrono((CHRONO *)&errcount);
      mSleep((long)i);
      if (bPauseArduinoPressureSensor == 0) break;
      if (chrono_period._68_4_ != 0) {
        printf("ArduinoPressureSensor paused.\n");
        chrono_period._68_4_ = 0;
        DisconnectArduinoPressureSensor
                  ((ARDUINOPRESSURESENSOR *)&arduinopressuresensordata.Pressure);
      }
      if (bExit != 0) goto LAB_001ca902;
      mSleep(100);
    }
    if (bRestartArduinoPressureSensor != 0) {
      if (chrono_period._68_4_ != 0) {
        printf("Restarting an ArduinoPressureSensor.\n");
        chrono_period._68_4_ = 0;
        DisconnectArduinoPressureSensor
                  ((ARDUINOPRESSURESENSOR *)&arduinopressuresensordata.Pressure);
      }
      bRestartArduinoPressureSensor = 0;
    }
    if (chrono_period._68_4_ == 0) {
      iVar1 = ConnectArduinoPressureSensor
                        ((ARDUINOPRESSURESENSOR *)&arduinopressuresensordata.Pressure,
                         "ArduinoPressureSensor0.txt");
      if (iVar1 == 0) {
        chrono_period._68_4_ = 1;
        i = arduinopressuresensor.BaudRate;
        memset(&pressure_prev,0,0x28);
        StopChronoQuick((CHRONO *)local_5f8);
        StartChrono((CHRONO *)local_5f8);
        if (arduinopressuresensor.RS232Port._784_8_ != 0) {
          fclose((FILE *)arduinopressuresensor.RS232Port._784_8_);
          arduinopressuresensor.RS232Port.DevType = 0;
          arduinopressuresensor.RS232Port._788_4_ = 0;
        }
        if ((arduinopressuresensor.timeout != 0) && (arduinopressuresensor.RS232Port._784_8_ == 0))
        {
          sVar2 = strlen((char *)&arduinopressuresensor.LastArduinoPressureSensorData.Pressure);
          if (sVar2 == 0) {
            sprintf(local_858,"arduinopressuresensor");
          }
          else {
            sprintf(local_858,"%.127s",&arduinopressuresensor.LastArduinoPressureSensorData.Pressure
                   );
          }
          sVar2 = strlen(local_858);
          szSaveFilePath._252_4_ = (undefined4)sVar2;
          do {
            szSaveFilePath._252_4_ = szSaveFilePath._252_4_ + -1;
            if ((int)szSaveFilePath._252_4_ < 0) break;
          } while (local_858[(int)szSaveFilePath._252_4_] != '.');
          if ((0 < (int)szSaveFilePath._252_4_) &&
             (sVar2 = strlen(local_858), (int)szSaveFilePath._252_4_ < (int)sVar2)) {
            sVar2 = strlen(local_858);
            memset(local_858 + (int)szSaveFilePath._252_4_,0,
                   sVar2 - (long)(int)szSaveFilePath._252_4_);
          }
          EnterCriticalSection(&strtimeCS);
          pcVar3 = strtimeex_fns();
          sprintf(szTemp + 0xf8,"log/%.127s_%.64s.txt",local_858,pcVar3);
          LeaveCriticalSection(&strtimeCS);
          arduinopressuresensor.RS232Port._784_8_ = fopen(szTemp + 0xf8,"w");
          if ((FILE *)arduinopressuresensor.RS232Port._784_8_ == (FILE *)0x0) {
            printf("Unable to create ArduinoPressureSensor data file.\n");
            goto LAB_001ca902;
          }
        }
      }
      else {
        chrono_period._68_4_ = 0;
        mSleep(1000);
      }
    }
    else {
      iVar1 = GetLatestDataArduinoPressureSensor
                        ((ARDUINOPRESSURESENSOR *)&arduinopressuresensordata.Pressure,
                         (ARDUINOPRESSURESENSORDATA *)&pressure_prev);
      if (iVar1 == 0) {
        EnterCriticalSection(&StateVariablesCS);
        pressure_mes = arduinopressuresensordata.altitude;
        dVar4 = GetTimeElapsedChronoQuick((CHRONO *)local_5f8);
        if ((2.0 < dVar4) && (dVar4 = GetTimeElapsedChronoQuick((CHRONO *)local_5f8), dVar4 <= 3.0))
        {
          filteredpressure = arduinopressuresensordata.altitude;
        }
        dVar4 = GetTimeElapsedChronoQuick((CHRONO *)local_5f8);
        if (dVar4 <= 3.0) {
          chrono_filter._64_8_ = arduinopressuresensordata.altitude;
        }
        else {
          chrono_filter._64_8_ = filteredpressure;
          if (ABS(arduinopressuresensordata.altitude - filteredpressure) < 0.05) {
            filteredpressure = arduinopressuresensordata.altitude;
            chrono_filter._64_8_ = filteredpressure;
          }
        }
        local_890 = Pressure2Height((double)chrono_filter._64_8_,
                                    (double)arduinopressuresensor._1360_8_,
                                    arduinopressuresensor.PressureRef);
        interval::interval(&local_888,&local_890);
        local_8b0 = -z_pressure_acc;
        interval::interval(&local_8a8,&local_8b0,&z_pressure_acc);
        operator+(&local_870,&local_888,&local_8a8);
        interval::operator=((interval *)&z_pressure,&local_870);
        LeaveCriticalSection(&StateVariablesCS);
      }
      else {
        printf("Connection to an ArduinoPressureSensor lost.\n");
        chrono_period._68_4_ = 0;
        DisconnectArduinoPressureSensor
                  ((ARDUINOPRESSURESENSOR *)&arduinopressuresensordata.Pressure);
      }
    }
    if (((chrono_period._68_4_ == 0) && (local_650 = local_650 + 1, 0 < ExitOnErrorCount)) &&
       (ExitOnErrorCount <= local_650)) {
      bExit = 1;
    }
    if (bExit != 0) {
LAB_001ca902:
      StopChronoQuick((CHRONO *)&errcount);
      StopChronoQuick((CHRONO *)local_5f8);
      if (arduinopressuresensor.RS232Port._784_8_ != 0) {
        fclose((FILE *)arduinopressuresensor.RS232Port._784_8_);
        arduinopressuresensor.RS232Port.DevType = 0;
        arduinopressuresensor.RS232Port._788_4_ = 0;
      }
      if (chrono_period._68_4_ != 0) {
        DisconnectArduinoPressureSensor
                  ((ARDUINOPRESSURESENSOR *)&arduinopressuresensordata.Pressure);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE ArduinoPressureSensorThread(void* pParam)
{
	ARDUINOPRESSURESENSOR arduinopressuresensor;
	ARDUINOPRESSURESENSORDATA arduinopressuresensordata;
	double pressure_prev = 0, filteredpressure = 0;
	CHRONO chrono_filter;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 50;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&arduinopressuresensor, 0, sizeof(ARDUINOPRESSURESENSOR));

	StartChrono(&chrono_filter);

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseArduinoPressureSensor) 
		{ 
			if (bConnected)
			{
				printf("ArduinoPressureSensor paused.\n");
				bConnected = FALSE;
				DisconnectArduinoPressureSensor(&arduinopressuresensor);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartArduinoPressureSensor) 
		{ 
			if (bConnected)
			{
				printf("Restarting an ArduinoPressureSensor.\n");
				bConnected = FALSE;
				DisconnectArduinoPressureSensor(&arduinopressuresensor);
			}
			bRestartArduinoPressureSensor = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectArduinoPressureSensor(&arduinopressuresensor, "ArduinoPressureSensor0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = arduinopressuresensor.threadperiod;

				memset(&arduinopressuresensordata, 0, sizeof(arduinopressuresensordata));
				StopChronoQuick(&chrono_filter);
				StartChrono(&chrono_filter);

				if (arduinopressuresensor.pfSaveFile != NULL)
				{
					fclose(arduinopressuresensor.pfSaveFile); 
					arduinopressuresensor.pfSaveFile = NULL;
				}
				if ((arduinopressuresensor.bSaveRawData)&&(arduinopressuresensor.pfSaveFile == NULL)) 
				{
					if (strlen(arduinopressuresensor.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", arduinopressuresensor.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "arduinopressuresensor");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					arduinopressuresensor.pfSaveFile = fopen(szSaveFilePath, "w");
					if (arduinopressuresensor.pfSaveFile == NULL) 
					{
						printf("Unable to create ArduinoPressureSensor data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetLatestDataArduinoPressureSensor(&arduinopressuresensor, &arduinopressuresensordata) == EXIT_SUCCESS)
			{
				EnterCriticalSection(&StateVariablesCS);
				pressure_mes = arduinopressuresensordata.Pressure;
				if ((GetTimeElapsedChronoQuick(&chrono_filter) > 2)&&(GetTimeElapsedChronoQuick(&chrono_filter) <= 3))
				{
					pressure_prev = arduinopressuresensordata.Pressure; // Initialization of pressure_prev...
				}
				if (GetTimeElapsedChronoQuick(&chrono_filter) > 3)
				{
					if (fabs(arduinopressuresensordata.Pressure-pressure_prev) < 0.05)
					{
						filteredpressure = arduinopressuresensordata.Pressure;
						pressure_prev = filteredpressure;
					}
					else
					{
						// Ignore outlier...
						filteredpressure = pressure_prev;
					}
				}
				else
				{
					filteredpressure = arduinopressuresensordata.Pressure;
				}
				z_pressure = Pressure2Height(filteredpressure, arduinopressuresensor.PressureRef, arduinopressuresensor.WaterDensity)+interval(-z_pressure_acc, z_pressure_acc);
				LeaveCriticalSection(&StateVariablesCS);
			}
			else
			{
				printf("Connection to an ArduinoPressureSensor lost.\n");
				bConnected = FALSE;
				DisconnectArduinoPressureSensor(&arduinopressuresensor);
			}
		}

		//printf("ArduinoPressureSensorThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	StopChronoQuick(&chrono_filter);

	if (arduinopressuresensor.pfSaveFile != NULL)
	{
		fclose(arduinopressuresensor.pfSaveFile); 
		arduinopressuresensor.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectArduinoPressureSensor(&arduinopressuresensor);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}